

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

Vector<double,_3U> *
OpenMD::mCross<double,3u,3u>(RectMatrix<double,_3U,_3U> *t1,RectMatrix<double,_3U,_3U> *t2)

{
  double *pdVar1;
  uint i_00;
  uint i_01;
  RectMatrix<double,_3U,_3U> *in_RDX;
  RectMatrix<double,_3U,_3U> *in_RSI;
  Vector<double,_3U> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint j;
  uint i;
  uint i2;
  uint i1;
  Vector<double,_3U> *result;
  undefined4 local_28;
  undefined4 local_24;
  
  Vector<double,_3U>::Vector(in_RDI);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    i_00 = (local_24 + 1) % 3;
    i_01 = (local_24 + 2) % 3;
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      dVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,i_00,local_28);
      dVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,i_01,local_28);
      dVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,i_01,local_28);
      dVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,i_00,local_28);
      pdVar1 = Vector<double,_3U>::operator[](in_RDI,local_24);
      *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5) + *pdVar1;
    }
  }
  return in_RDI;
}

Assistant:

inline Vector<Real, Row> mCross(const RectMatrix<Real, Row, Col>& t1,
                                  const RectMatrix<Real, Row, Col>& t2) {
    Vector<Real, Row> result;
    unsigned int i1;
    unsigned int i2;

    for (unsigned int i = 0; i < Row; i++) {
      i1 = (i + 1) % Row;
      i2 = (i + 2) % Row;
      for (unsigned int j = 0; j < Col; j++) {
        result[i] += t1(i1, j) * t2(i2, j) - t1(i2, j) * t2(i1, j);
      }
    }
    return result;
  }